

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::optional<dap::ExceptionDetails>_>::construct
          (BasicTypeInfo<dap::optional<dap::ExceptionDetails>_> *this,void *ptr)

{
  memset(ptr,0,0xf0);
  optional<dap::ExceptionDetails>::optional((optional<dap::ExceptionDetails> *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }